

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest3_4::inspectProgramResourceiv
          (FunctionalTest3_4 *this,GLuint program_id,GLchar **subroutine_names,
          GLchar **uniform_names)

{
  ostringstream *this_00;
  uint uVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  GLuint GVar5;
  deUint32 err;
  undefined4 extraout_var;
  size_t sVar6;
  ulong uVar7;
  bool bVar8;
  ulong uVar9;
  GLuint i;
  GLint subroutine;
  long lVar10;
  GLint i_1;
  long lVar11;
  GLenum prop;
  long local_210;
  vector<int,_std::allocator<int>_> compatible_subroutines;
  GLenum local_1e8 [6];
  undefined4 local_1d0;
  GLint local_1cc;
  GLchar **local_1c0;
  long local_1b8;
  MessageBuilder message;
  
  local_1c0 = uniform_names;
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_210 = CONCAT44(extraout_var,iVar4);
  bVar8 = true;
  for (lVar10 = 0; local_1e8[5] = this->m_n_active_subroutines, lVar10 < (int)local_1e8[5];
      lVar10 = lVar10 + 1) {
    pcVar2 = subroutine_names[lVar10];
    sVar6 = strlen(pcVar2);
    bVar3 = checkProgramResourceiv(this,program_id,0x92e8,0x92f9,pcVar2,(int)sVar6 + 1);
    bVar8 = (bool)(bVar8 & bVar3);
  }
  local_1e8[0] = 0x92f9;
  local_1e8[2] = 0x92fb;
  local_1e8[3] = 1;
  local_1e8[4] = 0x8e4a;
  local_1d0 = 0x930e;
  for (local_1b8 = 0; local_1b8 < this->m_n_active_subroutine_uniforms; local_1b8 = local_1b8 + 1) {
    pcVar2 = local_1c0[local_1b8];
    sVar6 = strlen(pcVar2);
    local_1cc = getSubroutineUniformLocation(this,program_id,pcVar2,true);
    local_1e8[1] = (int)sVar6 + 1;
    for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
      bVar3 = checkProgramResourceiv
                        (this,program_id,0x92ee,local_1e8[lVar10 * 2],pcVar2,
                         local_1e8[lVar10 * 2 + 1]);
      bVar8 = (bool)(bVar8 & bVar3);
    }
    GVar5 = getProgramResourceIndex(this,program_id,0x92ee,pcVar2);
    if (GVar5 != 0xffffffff) {
      compatible_subroutines.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      compatible_subroutines.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      compatible_subroutines.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      prop = 0x8e4b;
      std::vector<int,_std::allocator<int>_>::resize
                (&compatible_subroutines,(long)this->m_n_active_subroutines);
      (**(code **)(local_210 + 0x9c8))
                (program_id,0x92ee,GVar5,1,&prop,this->m_n_active_subroutines,0);
      err = (**(code **)(local_210 + 0x800))();
      glu::checkError(err,"GetProgramResourceiv",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0xd47);
      uVar1 = this->m_n_active_subroutines;
      uVar7 = 0;
      uVar9 = 0;
      if (0 < (int)uVar1) {
        uVar9 = (ulong)uVar1;
      }
      iVar4 = 0;
      this_00 = &message.m_str;
      for (; uVar9 != uVar7; uVar7 = uVar7 + 1) {
        iVar4 = iVar4 + compatible_subroutines.super__Vector_base<int,_std::allocator<int>_>._M_impl
                        .super__Vector_impl_data._M_start[uVar7];
      }
      if ((int)((uVar1 - 1) * uVar1) / 2 != iVar4) {
        message.m_log = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
        std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,
                        "Error. Invalid result. Function: getProgramResourceiv. ");
        std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,
                        "Program interface: GL_VERTEX_SUBROUTINE_UNIFORM. ");
        std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,
                        "Resource name: ");
        std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,pcVar2);
        std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,". ");
        std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,
                        "Property: GL_COMPATIBLE_SUBROUTINES. ");
        std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,"Results: ");
        lVar10 = 4;
        for (lVar11 = 1; lVar11 < this->m_n_active_subroutines; lVar11 = lVar11 + 1) {
          tcu::MessageBuilder::operator<<
                    (&message,(int *)((long)compatible_subroutines.
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start + lVar10));
          lVar10 = lVar10 + 4;
        }
        tcu::MessageBuilder::operator<<(&message,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
        bVar8 = false;
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&compatible_subroutines.super__Vector_base<int,_std::allocator<int>_>);
    }
  }
  return bVar8;
}

Assistant:

bool FunctionalTest3_4::inspectProgramResourceiv(GLuint program_id, const GLchar** subroutine_names,
												 const GLchar** uniform_names) const
{
	const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
	bool				  result = true;

	for (GLint subroutine = 0; subroutine < m_n_active_subroutines; ++subroutine)
	{
		const GLchar* subroutine_name = subroutine_names[subroutine];
		const GLint   length		  = (GLint)strlen(subroutine_name) + 1;

		if (false == checkProgramResourceiv(program_id, GL_VERTEX_SUBROUTINE, GL_NAME_LENGTH, subroutine_name, length))
		{
			result = false;
		}
	}

	inspectionDetails details[] = {
		{ GL_NAME_LENGTH, 0 },
		{ GL_ARRAY_SIZE, 1 },
		{ GL_NUM_COMPATIBLE_SUBROUTINES, m_n_active_subroutines },
		{ GL_LOCATION, 0 },
	};
	const GLuint n_details = sizeof(details) / sizeof(details[0]);

	for (GLint uniform = 0; uniform < m_n_active_subroutine_uniforms; ++uniform)
	{
		const GLchar* uniform_name = uniform_names[uniform];
		const GLint   length	   = (GLint)strlen(uniform_name) + 1;
		const GLint   location	 = getSubroutineUniformLocation(program_id, uniform_name, true);

		details[0].expected_value = length;
		details[3].expected_value = location;

		for (GLuint i = 0; i < n_details; ++i)
		{
			if (false == checkProgramResourceiv(program_id, GL_VERTEX_SUBROUTINE_UNIFORM, details[i].pname,
												uniform_name, details[i].expected_value))
			{
				result = false;
			}
		}

		/* Check compatible subroutines */
		GLuint index = getProgramResourceIndex(program_id, GL_VERTEX_SUBROUTINE_UNIFORM, uniform_name);

		if (GL_INVALID_INDEX != index)
		{
			std::vector<GLint> compatible_subroutines;
			GLint			   index_sum = 0;
			GLenum			   prop		 = GL_COMPATIBLE_SUBROUTINES;

			compatible_subroutines.resize(m_n_active_subroutines);

			gl.getProgramResourceiv(program_id, GL_VERTEX_SUBROUTINE_UNIFORM, index, 1, &prop, m_n_active_subroutines,
									0, &compatible_subroutines[0]);

			GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramResourceiv");

			/* Expected indices are 0, 1, 2, ... N */
			for (GLint i = 0; i < m_n_active_subroutines; ++i)
			{
				index_sum += compatible_subroutines[i];
			}

			/* Sum of E1, ..., EN = (E1 + EN) * N / 2 */
			if (((m_n_active_subroutines - 1) * m_n_active_subroutines) / 2 != index_sum)
			{
				tcu::MessageBuilder message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

				message << "Error. Invalid result. Function: getProgramResourceiv. "
						<< "Program interface: GL_VERTEX_SUBROUTINE_UNIFORM. "
						<< "Resource name: " << uniform_name << ". "
						<< "Property: GL_COMPATIBLE_SUBROUTINES. "
						<< "Results: ";

				for (GLint i = 1; i < m_n_active_subroutines; ++i)
				{
					message << compatible_subroutines[i];
				}

				message << tcu::TestLog::EndMessage;

				result = false;
			}
		}
	}

	return result;
}